

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

int Gia_ManQuantExist2(Gia_Man_t *p0,int iLit,_func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int c;
  Gia_Obj_t *pObj;
  Gia_Man_t *p;
  Vec_Int_t *pVVar5;
  Vec_Int_t *vLits;
  uint uVar6;
  ulong uVar7;
  int Fill;
  ulong uVar8;
  Vec_Int_t *p_00;
  long lVar9;
  int OutLit;
  Vec_Int_t *local_60;
  Vec_Int_t *vCis;
  Gia_Man_t *local_50;
  Gia_Man_t *local_48;
  Vec_Int_t *local_40;
  int pLits [2];
  
  iVar2 = Abc_Lit2Var(iLit);
  pObj = Gia_ManObj(p0,iVar2);
  OutLit = -1;
  if (1 < iLit) {
    uVar6 = (uint)*(undefined8 *)pObj;
    if ((~uVar6 & 0x9fffffff) == 0) {
      iVar2 = Gia_ObjCioId(pObj);
      iVar2 = (*pFuncCiToKeep)(pData,iVar2);
      if (iVar2 == 0) {
        iLit = 1;
      }
    }
    else {
      if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                      ,300,"int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)")
        ;
      }
      p = Gia_ManQuantDupConeSupp(p0,iLit,pFuncCiToKeep,pData,&vCis,&OutLit);
      iVar2 = p->iSuppPi;
      if (iVar2 != 0) {
        if ((iVar2 < 1) || (p->nSuppWords * 0x40 < iVar2)) {
          __assert_fail("pNew->iSuppPi > 0 && pNew->iSuppPi <= 64 * pNew->nSuppWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x134,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        local_48 = p0;
        pVVar5 = Vec_IntAlloc(100);
        vLits = Vec_IntAlloc(100);
        if (OutLit < 2) {
          __assert_fail("OutLit > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x137,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        local_60 = pVVar5;
        Vec_IntPush(pVVar5,OutLit);
        local_40 = &p->vCopiesTwo;
        local_50 = p;
        while (p_00 = vLits, pVVar5 = local_40, vLits = local_60, iVar2 = p->iSuppPi,
              p->iSuppPi = iVar2 + -1, 0 < iVar2) {
          iVar2 = Vec_IntEntry(local_60,0);
          Abc_Lit2Var(iVar2);
          iVar2 = p->nObjs * 2;
          if ((p->vCopiesTwo).nSize < iVar2) {
            Vec_IntFillExtra(pVVar5,iVar2,Fill);
          }
          if (vLits->nSize < 1) {
            __assert_fail("Vec_IntSize(vOuts) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                          ,0x142,
                          "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
          }
          p_00->nSize = 0;
          Gia_ManIncrementTravId(p);
          for (iVar2 = 0; iVar2 < vLits->nSize; iVar2 = iVar2 + 1) {
            iVar3 = Vec_IntEntry(vLits,iVar2);
            iVar4 = Abc_Lit2Var(iVar3);
            Gia_ManQuantExist_rec(p,iVar4,pLits);
            for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
              iVar4 = pLits[lVar9];
              c = Abc_LitIsCompl(iVar3);
              iVar4 = Abc_LitNotCond(iVar4,c);
              if (iVar4 != 0) {
                if (iVar4 == 1) {
                  Vec_IntFree(local_60);
                  Vec_IntFree(p_00);
                  Gia_ManStop(local_50);
                  Vec_IntFree(vCis);
                  return 1;
                }
                uVar7 = (ulong)(uint)p_00->nSize;
                if (p_00->nSize < 1) {
                  uVar7 = 0;
                }
                uVar8 = 0;
                do {
                  if (uVar7 == uVar8) {
                    Vec_IntPush(p_00,iVar4);
                    break;
                  }
                  piVar1 = p_00->pArray + uVar8;
                  uVar8 = uVar8 + 1;
                } while (*piVar1 != iVar4);
              }
            }
            vLits = local_60;
            p = local_50;
          }
          vLits->nSize = 0;
          local_60 = p_00;
        }
        iVar2 = local_60->nSize;
        if (iVar2 < 1) {
          __assert_fail("Vec_IntSize(vOuts) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x15d,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
          iVar2 = Vec_IntEntry(vLits,iVar3);
          iVar2 = Abc_LitNot(iVar2);
          Vec_IntWriteEntry(vLits,iVar3,iVar2);
          iVar2 = vLits->nSize;
        }
        OutLit = Gia_ManHashAndMulti(p,vLits);
        OutLit = Abc_LitNot(OutLit);
        Vec_IntFree(vLits);
        Vec_IntFree(p_00);
        Gia_ManAppendCo(p,OutLit);
        iLit = Gia_ManDupConeBack(local_48,p,vCis);
      }
      Gia_ManStop(p);
      Vec_IntFree(vCis);
    }
  }
  return iLit;
}

Assistant:

int Gia_ManQuantExist2( Gia_Man_t * p0, int iLit, int(*pFuncCiToKeep)(void *, int), void * pData )
{
//    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vOuts, * vOuts2, * vCis; 
    Gia_Obj_t * pObj = Gia_ManObj( p0, Abc_Lit2Var(iLit) );
    int i, n, Entry, Lit, OutLit = -1, pLits[2], nVarsQua, nAndsOld, nAndsNew; 
    if ( iLit < 2 ) return iLit;
    if ( Gia_ObjIsCi(pObj) ) return pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) ? iLit : 1;
    assert( Gia_ObjIsAnd(pObj) );
    pNew = Gia_ManQuantDupConeSupp( p0, iLit, pFuncCiToKeep, pData, &vCis, &OutLit );
    if ( pNew->iSuppPi == 0 )
    {
        Gia_ManStop( pNew );
        Vec_IntFree( vCis );
        return iLit;
    }
    assert( pNew->iSuppPi > 0 && pNew->iSuppPi <= 64 * pNew->nSuppWords );
    vOuts = Vec_IntAlloc( 100 );
    vOuts2 = Vec_IntAlloc( 100 );
    assert( OutLit > 1 );
    Vec_IntPush( vOuts, OutLit );
    nVarsQua = pNew->iSuppPi;
    nAndsOld = Gia_ManAndNum(pNew);
    while ( --pNew->iSuppPi >= 0 )
    {
        Entry = Abc_Lit2Var( Vec_IntEntry(vOuts, 0) );
//        printf( "Quantifying input %d with %d affected nodes (out of %d):\n", 
//            pNew->iSuppPi, Gia_ManQuantCountUsed(pNew,Entry), Gia_ManAndNum(pNew) );
        if ( Vec_IntSize(&pNew->vCopiesTwo) < 2*Gia_ManObjNum(pNew) )
            Vec_IntFillExtra( &pNew->vCopiesTwo, 2*Gia_ManObjNum(pNew), -1 );
        assert( Vec_IntSize(vOuts) > 0 );
        Vec_IntClear( vOuts2 );
        Gia_ManIncrementTravId( pNew );
        Vec_IntForEachEntry( vOuts, Entry, i )
        {
            Gia_ManQuantExist_rec( pNew, Abc_Lit2Var(Entry), pLits );
            for ( n = 0; n < 2; n++ )
            {
                Lit = Abc_LitNotCond( pLits[n], Abc_LitIsCompl(Entry) );
                if ( Lit == 0 )
                    continue;
                if ( Lit == 1 )
                {
                    Vec_IntFree( vOuts );
                    Vec_IntFree( vOuts2 );
                    Gia_ManStop( pNew );
                    Vec_IntFree( vCis );
                    return 1;
                }
                Vec_IntPushUnique( vOuts2, Lit );
            }
        }
        Vec_IntClear( vOuts );
        ABC_SWAP( Vec_Int_t *, vOuts, vOuts2 );
    }
//    printf( "\n" );
    //printf( "The number of diff cofactors = %d.\n", Vec_IntSize(vOuts) );
    assert( Vec_IntSize(vOuts) > 0 );
    Vec_IntForEachEntry( vOuts, Entry, i )
        Vec_IntWriteEntry( vOuts, i, Abc_LitNot(Entry) );
    OutLit = Gia_ManHashAndMulti( pNew, vOuts );
    OutLit = Abc_LitNot( OutLit );
    Vec_IntFree( vOuts );
    Vec_IntFree( vOuts2 );
    // transfer back
    Gia_ManAppendCo( pNew, OutLit );
    nAndsNew = Gia_ManAndNum(p0);
    Lit = Gia_ManDupConeBack( p0, pNew, vCis );
    nAndsNew = Gia_ManAndNum(p0) - nAndsNew;
    Gia_ManStop( pNew );
    // report the result
//    printf( "Performed quantification with %6d nodes, %3d keep-vars, %3d quant-vars, resulting in %5d new nodes. \n", 
//        nAndsOld, Vec_IntSize(vCis) - nVarsQua, nVarsQua, nAndsNew );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_IntFree( vCis );
    return Lit;
}